

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramPipelineStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::PipelineProgramCase::iterate(PipelineProgramCase *this)

{
  TestLog *pTVar1;
  GLbitfield GVar2;
  int iVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  TestError *this_00;
  GLbitfield stages;
  allocator<char> local_272;
  allocator<char> local_271;
  ProgramPipeline pipeline;
  ScopedLogSection section;
  string local_248;
  CallLogWrapper gl;
  ShaderProgram program;
  ResultCollector result;
  ProgramSources sources;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sources," // ERROR: ",(allocator<char> *)&program);
  tcu::ResultCollector::ResultCollector(&result,pTVar1,(string *)&sources);
  std::__cxx11::string::~string((string *)&sources);
  GVar4 = this->m_targetStage;
  GVar2 = 0x20;
  if (GVar4 == 0x8b30) {
    GVar2 = 2;
  }
  stages = 1;
  if (GVar4 != 0x8b31) {
    stages = GVar2;
  }
  memset(&sources,0,0xac);
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  sources._193_8_ = 0;
  if (GVar4 == 0x8b30) {
    sources._193_8_ = 0x100000000000000;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pipeline,
               "#version 310 es\nin highp vec4 v_color;\nlayout(location=0) out highp vec4 o_color;\nvoid main()\n{\n\to_color = v_color;\n}\n"
               ,(allocator<char> *)&local_248);
    glu::FragmentSource::FragmentSource((FragmentSource *)&program,(string *)&pipeline);
    glu::ProgramSources::operator<<(&sources,(ShaderSource *)&program);
  }
  else if (GVar4 == 0x91b9) {
    sources._193_8_ = 0x100000000000000;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pipeline,
               "#version 310 es\nlayout (local_size_x = 1, local_size_y = 1) in;\nlayout(binding = 0) buffer Output\n{\n\thighp float val;\n} sb_out;\n\nvoid main (void)\n{\n\tsb_out.val = 1.0;\n}\n"
               ,(allocator<char> *)&local_248);
    glu::ComputeSource::ComputeSource((ComputeSource *)&program,(string *)&pipeline);
    glu::ProgramSources::operator<<(&sources,(ShaderSource *)&program);
  }
  else {
    if (GVar4 != 0x8b31) goto LAB_012c11ab;
    sources._193_8_ = 0x100000000000000;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pipeline,
               "#version 310 es\nout highp vec4 v_color;\nvoid main()\n{\n\tgl_Position = vec4(float(gl_VertexID) * 0.5, float(gl_VertexID+1) * 0.5, 0.0, 1.0);\n\tv_color = vec4(float(gl_VertexID), 1.0, 0.0, 1.0);\n}\n"
               ,(allocator<char> *)&local_248);
    glu::VertexSource::VertexSource((VertexSource *)&program,(string *)&pipeline);
    glu::ProgramSources::operator<<(&sources,(ShaderSource *)&program);
  }
  std::__cxx11::string::~string
            ((string *)
             &program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&pipeline);
LAB_012c11ab:
  gl.m_enableLog = true;
  glu::ShaderProgram::ShaderProgram
            (&program,((this->super_TestCase).m_context)->m_renderCtx,&sources);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&pipeline,"program",&local_271);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"Program",&local_272);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&pipeline,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&pipeline);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  if (program.m_program.m_info.linkOk != false) {
    pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>((string *)&pipeline,"Initial",&local_271);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"Initial",&local_272);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&pipeline,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&pipeline);
    glu::ProgramPipeline::ProgramPipeline(&pipeline,((this->super_TestCase).m_context)->m_renderCtx)
    ;
    glu::CallLogWrapper::glBindProgramPipeline(&gl,pipeline.m_pipeline);
    GVar4 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar4,"setup pipeline",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                    ,200);
    deqp::gls::StateQueryUtil::verifyStatePipelineInteger
              (&result,&gl,pipeline.m_pipeline,this->m_targetStage,0,this->m_verifier);
    glu::ProgramPipeline::~ProgramPipeline(&pipeline);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>((string *)&pipeline,"Set",&local_271);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"Set",&local_272);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&pipeline,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&pipeline);
    glu::ProgramPipeline::ProgramPipeline(&pipeline,((this->super_TestCase).m_context)->m_renderCtx)
    ;
    glu::CallLogWrapper::glBindProgramPipeline(&gl,pipeline.m_pipeline);
    glu::CallLogWrapper::glUseProgramStages
              (&gl,pipeline.m_pipeline,stages,program.m_program.m_program);
    GVar4 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar4,"setup pipeline",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                    ,0xd3);
    deqp::gls::StateQueryUtil::verifyStatePipelineInteger
              (&result,&gl,pipeline.m_pipeline,this->m_targetStage,program.m_program.m_program,
               this->m_verifier);
    glu::ProgramPipeline::~ProgramPipeline(&pipeline);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    glu::ShaderProgram::~ShaderProgram(&program);
    tcu::ResultCollector::setTestContextResult
              (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    glu::ProgramSources::~ProgramSources(&sources);
    tcu::ResultCollector::~ResultCollector(&result);
    glu::CallLogWrapper::~CallLogWrapper(&gl);
    return STOP;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pipeline,"failed to build program",(allocator<char> *)&local_248);
  tcu::TestError::TestError(this_00,(string *)&pipeline);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

PipelineProgramCase::IterateResult PipelineProgramCase::iterate (void)
{
	glu::CallLogWrapper		gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	const int				stageBit	= (m_targetStage == GL_VERTEX_SHADER)	? (GL_VERTEX_SHADER_BIT)
										: (m_targetStage == GL_FRAGMENT_SHADER)	? (GL_FRAGMENT_SHADER_BIT)
										: (GL_COMPUTE_SHADER_BIT);
	glu::ProgramSources	sources;

	if (m_targetStage == GL_VERTEX_SHADER)
		sources << glu::ProgramSeparable(true) << glu::VertexSource(s_vertexSource);
	else if (m_targetStage == GL_FRAGMENT_SHADER)
		sources << glu::ProgramSeparable(true) << glu::FragmentSource(s_fragmentSource);
	else if (m_targetStage == GL_COMPUTE_SHADER)
		sources << glu::ProgramSeparable(true) << glu::ComputeSource(s_computeSource);
	else
		DE_ASSERT(false);

	gl.enableLogging(true);

	{
		glu::ShaderProgram program(m_context.getRenderContext(), sources);

		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "program", "Program");
			m_testCtx.getLog() << program;
		}

		if (!program.isOk())
			throw tcu::TestError("failed to build program");

		{
			const tcu::ScopedLogSection section		(m_testCtx.getLog(), "Initial", "Initial");
			glu::ProgramPipeline		pipeline	(m_context.getRenderContext());

			gl.glBindProgramPipeline(pipeline.getPipeline());
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup pipeline");

			verifyStatePipelineInteger(result, gl, pipeline.getPipeline(), m_targetStage, 0, m_verifier);
		}

		{
			const tcu::ScopedLogSection section		(m_testCtx.getLog(), "Set", "Set");
			glu::ProgramPipeline		pipeline	(m_context.getRenderContext());

			gl.glBindProgramPipeline(pipeline.getPipeline());
			gl.glUseProgramStages(pipeline.getPipeline(), stageBit, program.getProgram());
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup pipeline");

			verifyStatePipelineInteger(result, gl, pipeline.getPipeline(), m_targetStage, program.getProgram(), m_verifier);
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}